

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_teleport_random(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  source sVar3;
  source origin;
  char local_88 [8];
  char s [80];
  char sr [30];
  wchar_t range;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"range",(int *)(sr + 0x1c));
  if (wVar2 != L'\0') {
    memset(local_88,0,0x50);
    local_88[0] = '1';
    local_88[1] = 0x30;
    local_88[2] = 0x30;
    _Var1 = get_string("Teleport range? ",local_88,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_88,(int *)(sr + 0x1c));
    if (!_Var1) {
      return;
    }
    if (stack0xffffffffffffffec < L'\x01') {
      return;
    }
    cmd_set_arg_number((command *)cmd,"range",stack0xffffffffffffffec);
  }
  strnfmt(s + 0x48,0x1e,"%d",(ulong)(uint)stack0xffffffffffffffec);
  sVar3 = source_player();
  origin.which = sVar3.which;
  origin._4_4_ = 0;
  origin.what = sVar3.what;
  effect_simple(L';',origin,s + 0x48,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  return;
}

Assistant:

void do_cmd_wiz_teleport_random(struct command *cmd)
{
	int range;
	char sr[30];

	if (cmd_get_arg_number(cmd, "range", &range) != CMD_OK) {
		char s[80] = "100";

		if (!get_string("Teleport range? ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &range) || range < 1) return;
		cmd_set_arg_number(cmd, "range", range);
	}

	strnfmt(sr, sizeof(sr), "%d", range);
	effect_simple(EF_TELEPORT, source_player(), sr, 0, 0, 0, 0, 0, NULL);
}